

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  long lVar10;
  Float FVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  Vector3<float> VVar12;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  Tuple3<pbrt::Vector3,_float> local_b0;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  Tuple3<pbrt::Point3,_float> local_50;
  Tuple3<pbrt::Point3,_float> local_40;
  Tuple3<pbrt::Point3,_float> local_30;
  
  lVar9 = (long)this->triIndex * 0xc;
  lVar1 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar8 = *(long *)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar10 = (long)*(int *)(lVar8 + lVar9) * 0xc;
  local_30.z = *(float *)(lVar1 + 8 + lVar10);
  local_30._0_8_ = *(undefined8 *)(lVar1 + lVar10);
  lVar10 = (long)*(int *)(lVar8 + 4 + lVar9) * 0xc;
  local_40.z = *(float *)(lVar1 + 8 + lVar10);
  local_40._0_8_ = *(undefined8 *)(lVar1 + lVar10);
  lVar8 = (long)*(int *)(lVar8 + 8 + lVar9) * 0xc;
  local_50.z = *(float *)(lVar1 + 8 + lVar8);
  local_50._0_8_ = *(undefined8 *)(lVar1 + lVar8);
  VVar12 = Point3<float>::operator-((Point3<float> *)&local_30,p);
  local_70.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_70._0_8_ = vmovlps_avx(auVar2);
  VVar12 = Normalize<float>((Vector3<float> *)&local_70);
  local_60.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._8_8_ = extraout_XMM0_Qb_00;
  auVar3._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_60._0_8_ = vmovlps_avx(auVar3);
  VVar12 = Point3<float>::operator-((Point3<float> *)&local_40,p);
  local_90.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._8_8_ = extraout_XMM0_Qb_01;
  auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_90._0_8_ = vmovlps_avx(auVar4);
  VVar12 = Normalize<float>((Vector3<float> *)&local_90);
  local_80.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._8_8_ = extraout_XMM0_Qb_02;
  auVar5._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_80._0_8_ = vmovlps_avx(auVar5);
  VVar12 = Point3<float>::operator-((Point3<float> *)&local_50,p);
  local_b0.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_8_ = extraout_XMM0_Qb_03;
  auVar6._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_b0._0_8_ = vmovlps_avx(auVar6);
  VVar12 = Normalize<float>((Vector3<float> *)&local_b0);
  local_a0.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._8_8_ = extraout_XMM0_Qb_04;
  auVar7._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_a0._0_8_ = vmovlps_avx(auVar7);
  FVar11 = SphericalTriangleArea((Vector3f *)&local_60,(Vector3f *)&local_80,(Vector3f *)&local_a0);
  return FVar11;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }